

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::
     global_exscan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               size_t out,int *param_4)

{
  int iVar1;
  ulong uVar2;
  reference piVar3;
  reference piVar4;
  ulong local_d0;
  size_t i;
  int local_bc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_b8;
  T presum;
  size_t local_98;
  int *local_90;
  int *local_88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int local_74;
  undefined1 local_70 [4];
  T sum;
  comm nonzero_comm;
  size_t n;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> o;
  comm *comm_local;
  size_t local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  nonzero_comm._24_8_ = end._M_current;
  n = out;
  o._M_current = param_4;
  local_20 = out;
  out_local._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  uVar2 = std::
          distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    (begin,end);
  comm::split((comm *)local_70,(comm *)o._M_current,(uint)(uVar2 != 0));
  if (uVar2 != 0) {
    local_80 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&end_local,uVar2 - 1);
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_80);
    local_74 = *piVar3;
    local_88 = end_local._M_current;
    local_90 = out_local._M_current;
    local_98 = local_20;
    local_exscan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
              (end_local._M_current,out_local._M_current,local_20);
    _Stack_b8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n,
                          uVar2 - 1);
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&stack0xffffffffffffff48);
    local_74 = local_74 + *piVar4;
    iVar1 = exscan<int,std::plus<int>>(&local_74,local_70,1);
    local_bc = iVar1;
    i = (size_t)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n,0
                          );
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
    *piVar4 = iVar1;
    for (local_d0 = 1; local_d0 < uVar2; local_d0 = local_d0 + 1) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
      iVar1 = std::plus<int>::operator()((plus<int> *)((long)&comm_local + 7),&local_bc,piVar4);
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
      *piVar4 = iVar1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
    }
  }
  comm::~comm((comm *)local_70);
  return;
}

Assistant:

void global_exscan(InIterator begin, InIterator end, OutIterator out, Func func, const mxx::comm& comm = mxx::comm()) {
    OutIterator o = out;
    size_t n = std::distance(begin, end);
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        typedef typename std::iterator_traits<OutIterator>::value_type T;
        T sum = *(begin+(n-1));
        // local scan
        local_exscan(begin, end, out, func);
        // mxx::scan
        sum += *(o + (n-1));
        T presum = exscan(sum, func, nonzero_comm);
        *o++ = presum;
        // accumulate previous sum on all local elements
        for (size_t i = 1; i < n; ++i) {
            *o = func(presum, *o);
            ++o;
        }
    }
}